

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O0

void rehash(ecs_map_t *map,int32_t bucket_count)

{
  int elem_size_00;
  ecs_bucket_t *peVar1;
  ecs_map_key_t *peVar2;
  void *pvVar3;
  ecs_map_key_t key_00;
  int32_t iVar4;
  ecs_bucket_t *bucket_00;
  ecs_bucket_t *new_bucket;
  int32_t new_bucket_id;
  void *elem;
  ecs_map_key_t key;
  void *payload_array;
  ecs_map_key_t *key_array;
  int count;
  int i;
  ecs_bucket_t *bucket;
  int32_t bucket_id;
  ecs_bucket_t *buckets;
  ecs_size_t elem_size;
  int32_t bucket_count_local;
  ecs_map_t *map_local;
  
  _ecs_assert(bucket_count != 0,0xc,(char *)0x0,"bucket_count != 0",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/map.c"
              ,0xc1);
  if (bucket_count == 0) {
    __assert_fail("bucket_count != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/map.c"
                  ,0xc1,"void rehash(ecs_map_t *, int32_t)");
  }
  _ecs_assert(map->bucket_count < bucket_count,0xc,(char *)0x0,"bucket_count > map->bucket_count",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/map.c"
              ,0xc2);
  if (map->bucket_count < bucket_count) {
    elem_size_00 = map->elem_size;
    ensure_buckets(map,bucket_count);
    peVar1 = map->buckets;
    _ecs_assert(peVar1 != (ecs_bucket_t *)0x0,0xc,(char *)0x0,"buckets != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/map.c"
                ,0xc9);
    if (peVar1 != (ecs_bucket_t *)0x0) {
      for (bucket._4_4_ = bucket_count + -1; -1 < bucket._4_4_; bucket._4_4_ = bucket._4_4_ + -1) {
        bucket_00 = peVar1 + bucket._4_4_;
        key_array._0_4_ = bucket_00->count;
        peVar2 = bucket_00->keys;
        pvVar3 = bucket_00->payload;
        for (key_array._4_4_ = 0; key_array._4_4_ < (int32_t)key_array;
            key_array._4_4_ = key_array._4_4_ + 1) {
          key_00 = peVar2[key_array._4_4_];
          iVar4 = get_bucket_id(bucket_count,key_00);
          if (iVar4 != bucket._4_4_) {
            add_to_bucket(peVar1 + iVar4,elem_size_00,key_00,
                          (void *)((long)pvVar3 + (long)(elem_size_00 * key_array._4_4_)));
            remove_from_bucket(bucket_00,elem_size_00,key_00,key_array._4_4_);
            key_array._0_4_ = (int32_t)key_array + -1;
            key_array._4_4_ = key_array._4_4_ + -1;
          }
        }
        if (bucket_00->count == 0) {
          clear_bucket(bucket_00);
        }
      }
      return;
    }
    __assert_fail("buckets != ((void*)0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/map.c"
                  ,0xc9,"void rehash(ecs_map_t *, int32_t)");
  }
  __assert_fail("bucket_count > map->bucket_count",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/map.c"
                ,0xc2,"void rehash(ecs_map_t *, int32_t)");
}

Assistant:

static
void rehash(
    ecs_map_t *map,
    int32_t bucket_count)
{
    ecs_assert(bucket_count != 0, ECS_INTERNAL_ERROR, NULL);
    ecs_assert(bucket_count > map->bucket_count, ECS_INTERNAL_ERROR, NULL);

    ecs_size_t elem_size = map->elem_size;

    ensure_buckets(map, bucket_count);

    ecs_bucket_t *buckets = map->buckets;
    ecs_assert(buckets != NULL, ECS_INTERNAL_ERROR, NULL);
    
    int32_t bucket_id;

    /* Iterate backwards as elements could otherwise be moved to existing
        * buckets which could temporarily cause the number of elements in a
        * bucket to exceed BUCKET_COUNT. */
    for (bucket_id = bucket_count - 1; bucket_id >= 0; bucket_id --) {
        ecs_bucket_t *bucket = &buckets[bucket_id];

        int i, count = bucket->count;
        ecs_map_key_t *key_array = bucket->keys;
        void *payload_array = bucket->payload;

        for (i = 0; i < count; i ++) {
            ecs_map_key_t key = key_array[i];
            void *elem = GET_ELEM(payload_array, elem_size, i);
            int32_t new_bucket_id = get_bucket_id(bucket_count, key);

            if (new_bucket_id != bucket_id) {
                ecs_bucket_t *new_bucket = &buckets[new_bucket_id];

                add_to_bucket(new_bucket, elem_size, key, elem);
                remove_from_bucket(bucket, elem_size, key, i);

                count --;
                i --;
            }
        }

        if (!bucket->count) {
            clear_bucket(bucket);
        }
    }
}